

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O3

void __thiscall Equality_modelEqual_Test::TestBody(Equality_modelEqual_Test *this)

{
  byte bVar1;
  char cVar2;
  AssertionResult gtest_ar_;
  ModelPtr m2;
  ModelPtr m1;
  UnitsPtr u2;
  UnitsPtr u1;
  ComponentPtr c2;
  ComponentPtr c1;
  long *local_b0;
  AssertionResult local_a8;
  long local_98 [2];
  AssertHelper local_88 [8];
  byte local_80 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  shared_ptr *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  shared_ptr *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  string local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  string local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  string local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  string local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Model::create();
  libcellml::Model::create();
  local_a8._0_8_ = (shared_ptr *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"c","");
  libcellml::Component::create(local_20);
  if ((shared_ptr *)local_a8._0_8_ != (shared_ptr *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  local_a8._0_8_ = (shared_ptr *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"c","");
  libcellml::Component::create(local_30);
  if ((shared_ptr *)local_a8._0_8_ != (shared_ptr *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  local_a8._0_8_ = (shared_ptr *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"unitsA","");
  libcellml::Units::create(local_40);
  if ((shared_ptr *)local_a8._0_8_ != (shared_ptr *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  local_a8._0_8_ = (shared_ptr *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"unitsA","");
  libcellml::Units::create(local_50);
  if ((shared_ptr *)local_a8._0_8_ != (shared_ptr *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  libcellml::ComponentEntity::addComponent(local_60);
  libcellml::ComponentEntity::addComponent(local_70);
  libcellml::Model::addUnits(local_60);
  libcellml::Model::addUnits(local_70);
  local_a8._0_8_ = local_70;
  local_a8.message_.ptr_ = local_68;
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_68->_M_string_length = (int)local_68->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_68->_M_string_length = (int)local_68->_M_string_length + 1;
    }
  }
  local_80[0] = libcellml::Entity::equals(local_60);
  local_78.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  bVar1 = local_80[0];
  if (local_a8.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.message_.ptr_);
    bVar1 = local_80[0] & 1;
  }
  if (bVar1 == 0) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(char *)local_80,"m1->equals(m2)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x369,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(local_88,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    if ((shared_ptr *)local_a8._0_8_ != (shared_ptr *)local_98) {
      operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
    }
    if (((local_b0 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
       (local_b0 != (long *)0x0)) {
      (**(code **)(*local_b0 + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_a8._0_8_ = local_60;
  local_a8.message_.ptr_ = local_58;
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_58->_M_string_length = (int)local_58->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_58->_M_string_length = (int)local_58->_M_string_length + 1;
    }
  }
  local_80[0] = libcellml::Entity::equals(local_70);
  local_78.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  bVar1 = local_80[0];
  if (local_a8.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.message_.ptr_);
    bVar1 = local_80[0] & 1;
  }
  if (bVar1 == 0) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(char *)local_80,"m2->equals(m1)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x36a,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(local_88,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    if ((shared_ptr *)local_a8._0_8_ != (shared_ptr *)local_98) {
      operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
    }
    if (((local_b0 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
       (local_b0 != (long *)0x0)) {
      (**(code **)(*local_b0 + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68);
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58);
  }
  return;
}

Assistant:

TEST(Equality, modelEqual)
{
    libcellml::ModelPtr m1 = libcellml::Model::create();
    libcellml::ModelPtr m2 = libcellml::Model::create();

    libcellml::ComponentPtr c1 = libcellml::Component::create("c");
    libcellml::ComponentPtr c2 = libcellml::Component::create("c");

    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    m1->addComponent(c1);
    m2->addComponent(c2);

    m1->addUnits(u1);
    m2->addUnits(u2);

    EXPECT_TRUE(m1->equals(m2));
    EXPECT_TRUE(m2->equals(m1));
}